

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

UBool utrie_setRange32_63(UNewTrie *trie,UChar32 start,UChar32 limit,uint32_t value,UBool overwrite)

{
  uint32_t initialValue;
  int iVar1;
  uint uVar2;
  int32_t *piVar3;
  uint32_t *puVar4;
  UBool UVar5;
  uint uVar6;
  
  if (trie == (UNewTrie *)0x0) {
LAB_00110674:
    UVar5 = '\0';
  }
  else {
    if (limit < start) {
      return '\0';
    }
    if (0x110000 < (uint)limit) {
      return '\0';
    }
    if (0x10ffff < (uint)start) {
      return '\0';
    }
    if (trie->isCompacted != '\0') {
      return '\0';
    }
    if (start == limit) {
      return '\x01';
    }
    initialValue = *trie->data;
    uVar6 = start & 0x1f;
    if (uVar6 == 0) {
LAB_00110576:
      uVar6 = -(uint)(initialValue != value);
      piVar3 = trie->index + ((uint)start >> 5);
      for (; start < (int)(limit & 0x1fffe0U); start = start + 0x20) {
        iVar1 = *piVar3;
        if ((long)iVar1 < 1) {
          if ((trie->data[(uint)-iVar1] != value) && (overwrite != '\0' || iVar1 == 0)) {
            if ((int)uVar6 < 0) {
              uVar6 = utrie_getDataBlock(trie,start);
              if (-1 < (int)uVar6) {
                *piVar3 = -uVar6;
                puVar4 = trie->data + uVar6;
                UVar5 = '\x01';
                goto LAB_001105ca;
              }
              goto LAB_00110674;
            }
            *piVar3 = -uVar6;
          }
        }
        else {
          puVar4 = trie->data + iVar1;
          UVar5 = overwrite;
LAB_001105ca:
          utrie_fillBlock(puVar4,0,0x20,value,initialValue,UVar5);
        }
        piVar3 = piVar3 + 1;
      }
      if ((limit & 0x1fU) == 0) {
        return '\x01';
      }
      uVar6 = utrie_getDataBlock(trie,start);
      if ((int)uVar6 < 0) goto LAB_00110674;
      puVar4 = trie->data + uVar6;
      uVar6 = 0;
    }
    else {
      uVar2 = utrie_getDataBlock(trie,start);
      if ((int)uVar2 < 0) goto LAB_00110674;
      start = start + 0x20U & 0x3fffe0;
      puVar4 = trie->data + uVar2;
      if ((uint)start <= (uint)limit) {
        utrie_fillBlock(puVar4,uVar6,0x20,value,initialValue,overwrite);
        goto LAB_00110576;
      }
    }
    UVar5 = '\x01';
    utrie_fillBlock(puVar4,uVar6,limit & 0x1f,value,initialValue,overwrite);
  }
  return UVar5;
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_setRange32(UNewTrie *trie, UChar32 start, UChar32 limit, uint32_t value, UBool overwrite) {
    /*
     * repeat value in [start..limit[
     * mark index values for repeat-data blocks by setting bit 31 of the index values
     * fill around existing values if any, if(overwrite)
     */
    uint32_t initialValue;
    int32_t block, rest, repeatBlock;

    /* valid, uncompacted trie and valid indexes? */
    if( trie==NULL || trie->isCompacted ||
        (uint32_t)start>0x10ffff || (uint32_t)limit>0x110000 || start>limit
    ) {
        return FALSE;
    }
    if(start==limit) {
        return TRUE; /* nothing to do */
    }

    initialValue=trie->data[0];
    if(start&UTRIE_MASK) {
        UChar32 nextStart;

        /* set partial block at [start..following block boundary[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        nextStart=(start+UTRIE_DATA_BLOCK_LENGTH)&~UTRIE_MASK;
        if(nextStart<=limit) {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, UTRIE_DATA_BLOCK_LENGTH,
                            value, initialValue, overwrite);
            start=nextStart;
        } else {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, limit&UTRIE_MASK,
                            value, initialValue, overwrite);
            return TRUE;
        }
    }

    /* number of positions in the last, partial block */
    rest=limit&UTRIE_MASK;

    /* round down limit to a block boundary */
    limit&=~UTRIE_MASK;

    /* iterate over all-value blocks */
    if(value==initialValue) {
        repeatBlock=0;
    } else {
        repeatBlock=-1;
    }
    while(start<limit) {
        /* get index value */
        block=trie->index[start>>UTRIE_SHIFT];
        if(block>0) {
            /* already allocated, fill in value */
            utrie_fillBlock(trie->data+block, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, overwrite);
        } else if(trie->data[-block]!=value && (block==0 || overwrite)) {
            /* set the repeatBlock instead of the current block 0 or range block */
            if(repeatBlock>=0) {
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
            } else {
                /* create and set and fill the repeatBlock */
                repeatBlock=utrie_getDataBlock(trie, start);
                if(repeatBlock<0) {
                    return FALSE;
                }

                /* set the negative block number to indicate that it is a repeat block */
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
                utrie_fillBlock(trie->data+repeatBlock, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, TRUE);
            }
        }

        start+=UTRIE_DATA_BLOCK_LENGTH;
    }

    if(rest>0) {
        /* set partial block at [last block boundary..limit[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        utrie_fillBlock(trie->data+block, 0, rest, value, initialValue, overwrite);
    }

    return TRUE;
}